

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object3D.h
# Opt level: O0

void __thiscall Sphere::~Sphere(Sphere *this)

{
  Sphere *this_local;
  
  Object3D::~Object3D(&this->super_Object3D);
  return;
}

Assistant:

virtual ~Sphere() {}